

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cc
# Opt level: O0

void google::DumpPCAndSymbol(DebugWriter *writerfn,void *arg,void *pc,char *prefix)

{
  bool bVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  code *in_RDI;
  char buf [1024];
  char *symbol;
  char tmp [1024];
  char *in_stack_fffffffffffff7b8;
  void *in_stack_fffffffffffff7c0;
  char local_838 [1032];
  char *local_430;
  char local_428 [1032];
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  code *local_8;
  
  local_430 = "(unknown)";
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  bVar1 = Symbolize(in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8,0);
  if (bVar1) {
    local_430 = local_428;
  }
  snprintf(local_838,0x400,"%s@ %*p  %s\n",local_20,0x12,local_18,local_430);
  (*local_8)(local_838,local_10);
  return;
}

Assistant:

static void DumpPCAndSymbol(DebugWriter *writerfn, void *arg, void *pc,
                            const char * const prefix) {
  char tmp[1024];
  const char *symbol = "(unknown)";
  // Symbolizes the previous address of pc because pc may be in the
  // next function.  The overrun happens when the function ends with
  // a call to a function annotated noreturn (e.g. CHECK).
  if (Symbolize(reinterpret_cast<char *>(pc) - 1, tmp, sizeof(tmp))) {
      symbol = tmp;
  }
  char buf[1024];
  snprintf(buf, sizeof(buf), "%s@ %*p  %s\n",
           prefix, kPrintfPointerFieldWidth, pc, symbol);
  writerfn(buf, arg);
}